

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O1

void test_numeric_v6(void)

{
  undefined2 uVar1;
  uint16_t uVar2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 local_d0 [8];
  nng_sockaddr sa;
  nni_resolv_item item;
  nng_aio *aio;
  
  item.ri_host = (char *)0x0;
  item.ri_port = 0;
  item._18_6_ = 0;
  sa.s_storage.sa_pad[0xf] = 0;
  item.ri_family = 0;
  item.ri_passive = false;
  item._5_3_ = 0;
  local_d0._0_4_ = 4;
  unique0x10000263 =
       CONCAT17(v6loop[7],
                CONCAT16(v6loop[6],
                         CONCAT15(v6loop[5],
                                  CONCAT14(v6loop[4],
                                           CONCAT13(v6loop[3],
                                                    CONCAT12(v6loop[2],CONCAT11(v6loop[1],v6loop[0])
                                                            ))))));
  sa._4_8_ = CONCAT17(v6loop[0xf],
                      CONCAT16(v6loop[0xe],
                               CONCAT15(v6loop[0xd],
                                        CONCAT14(v6loop[0xc],
                                                 CONCAT13(v6loop[0xb],
                                                          CONCAT12(v6loop[10],
                                                                   CONCAT11(v6loop[9],v6loop[8])))))
                              ));
  iVar3 = nni_plat_udp_open((nni_plat_udp **)&item.ri_sa,(nni_sockaddr *)local_d0);
  if (iVar3 != 0) {
    return;
  }
  nni_plat_udp_close((nni_plat_udp *)&(item.ri_sa)->s_ipc);
  acutest_message_("IPV6 support present");
  nVar4 = nng_aio_alloc((nng_aio **)&item.ri_sa,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar5 = nng_strerror(nVar4);
  iVar3 = acutest_check_((uint)(nVar4 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x75,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar5,nVar4);
  if (iVar3 != 0) {
    item._0_8_ = anon_var_dwarf_4e5;
    item.ri_host = (char *)CONCAT62(item.ri_host._2_6_,0x50);
    sa.s_storage.sa_pad[0xf]._0_5_ = 0x100000004;
    item._16_8_ = (nni_sockaddr *)local_d0;
    nni_resolv((nni_resolv_item *)(sa.s_ipc.sa_path + 0x7e),(nni_aio *)&(item.ri_sa)->s_ipc);
    nng_aio_wait((nng_aio *)&(item.ri_sa)->s_ipc);
    nVar4 = nng_aio_result((nng_aio *)&(item.ri_sa)->s_ipc);
    pcVar5 = nng_strerror(nVar4);
    iVar3 = acutest_check_((uint)(nVar4 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                           ,0x7d,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar5,
                           nVar4);
    if (iVar3 != 0) {
      iVar3 = acutest_check_((uint)(local_d0._0_2_ == 4),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                             ,0x7e,"%s","sa.s_in6.sa_family == NNG_AF_INET6");
      uVar1 = local_d0._2_2_;
      uVar2 = nuts_be16((uint16_t)iVar3);
      acutest_check_((uint)(uVar1 == uVar2),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x7f,"%s","sa.s_in6.sa_port == nuts_be16(80)");
      auVar6[0] = -(local_d0[4] == v6loop[0]);
      auVar6[1] = -(local_d0[5] == v6loop[1]);
      auVar6[2] = -(local_d0[6] == v6loop[2]);
      auVar6[3] = -(local_d0[7] == v6loop[3]);
      auVar6[4] = -(sa.s_family._0_1_ == v6loop[4]);
      auVar6[5] = -(sa.s_family._1_1_ == v6loop[5]);
      auVar6[6] = -(sa.s_ipc.sa_path[0] == v6loop[6]);
      auVar6[7] = -(sa.s_ipc.sa_path[1] == v6loop[7]);
      auVar6[8] = -(sa.s_ipc.sa_path[2] == v6loop[8]);
      auVar6[9] = -(sa.s_ipc.sa_path[3] == v6loop[9]);
      auVar6[10] = -(sa.s_ipc.sa_path[4] == v6loop[10]);
      auVar6[0xb] = -(sa.s_ipc.sa_path[5] == v6loop[0xb]);
      auVar6[0xc] = -(sa.s_ipc.sa_path[6] == v6loop[0xc]);
      auVar6[0xd] = -(sa.s_ipc.sa_path[7] == v6loop[0xd]);
      auVar6[0xe] = -(sa.s_ipc.sa_path[8] == v6loop[0xe]);
      auVar6[0xf] = -(sa.s_ipc.sa_path[9] == v6loop[0xf]);
      acutest_check_((uint)((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x80,"%s","memcmp(sa.s_in6.sa_addr, v6loop, 16) == 0");
      nng_aio_free((nng_aio *)&(item.ri_sa)->s_ipc);
      return;
    }
  }
  acutest_abort_();
}

Assistant:

void
test_numeric_v6(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	nni_resolv_item item = { 0 };

	if (!has_v6()) {
		return;
	}
	NUTS_MSG("IPV6 support present");
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	item.ri_family  = NNG_AF_INET6;
	item.ri_host    = "::1";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in6.sa_family == NNG_AF_INET6);
	NUTS_TRUE(sa.s_in6.sa_port == nuts_be16(80));
	NUTS_TRUE(memcmp(sa.s_in6.sa_addr, v6loop, 16) == 0);
	nng_aio_free(aio);
}